

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTest.cpp
# Opt level: O0

void __thiscall PathTest::AppendTest(PathTest *this)

{
  bool bVar1;
  string *psVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  undefined1 local_38 [8];
  Path p;
  int i;
  PathTest *this_local;
  
  for (p.mPath.field_2._12_4_ = 0; (int)p.mPath.field_2._12_4_ < 3;
      p.mPath.field_2._12_4_ = p.mPath.field_2._12_4_ + 1) {
    JetHead::Path::Path((Path *)local_38,appendTestData[(int)p.mPath.field_2._12_4_].path1);
    JetHead::Path::append((Path *)local_38,appendTestData[(int)p.mPath.field_2._12_4_].path2);
    bVar1 = JetHead::Path::operator!=
                      ((Path *)local_38,appendTestData[(int)p.mPath.field_2._12_4_].result);
    if (bVar1) {
      pcVar4 = appendTestData[(int)p.mPath.field_2._12_4_].path1;
      pcVar5 = appendTestData[(int)p.mPath.field_2._12_4_].path2;
      psVar2 = JetHead::Path::getString_abi_cxx11_((Path *)local_38);
      uVar3 = std::__cxx11::string::c_str();
      TestCase::TestFailedInternal
                (&this->super_TestCase,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/PathTest.cpp"
                 ,0xe9,"Append of %s and %s failed (%s)",pcVar4,pcVar5,uVar3,pcVar4,pcVar5,psVar2);
    }
    JetHead::Path::~Path((Path *)local_38);
  }
  return;
}

Assistant:

void PathTest::AppendTest()
{
	for ( int i = 0; i < JH_ARRAY_SIZE( appendTestData ); i++ )
	{
		Path p = appendTestData[ i ].path1;
		p.append( appendTestData[ i ].path2 );
		if ( p != appendTestData[ i ].result )
		{
			TestFailed( "Append of %s and %s failed (%s)", 
				appendTestData[ i ].path1, 
				appendTestData[ i ].path2, 
				p.getString().c_str() );
		}
	}
}